

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetServerOrientation(VClient *this,Enum *o_rServerOrientation)

{
  reference_const_type pVVar1;
  Enum EVar2;
  Enum EVar3;
  scoped_lock Lock;
  
  boost::unique_lock<boost::recursive_mutex>::unique_lock(&Lock,&this->m_FrameMutex);
  EVar3 = Unknown;
  if ((this->m_CachedFrame).m_ApplicationInfo.super_type.m_initialized == true) {
    pVVar1 = boost::optional<ViconCGStream::VApplicationInfo>::get
                       (&(this->m_CachedFrame).m_ApplicationInfo);
    if (pVVar1->m_AxisOrientation == EZUp) {
      EVar3 = ZUp;
      EVar2 = EVar3;
    }
    else {
      EVar2 = ZUp;
      if (pVVar1->m_AxisOrientation == EYUp) {
        EVar3 = YUp;
      }
    }
  }
  else {
    EVar2 = 0x1b;
  }
  *o_rServerOrientation = EVar3;
  boost::unique_lock<boost::recursive_mutex>::~unique_lock(&Lock);
  return EVar2;
}

Assistant:

Result::Enum VClient::GetServerOrientation( ServerOrientation::Enum & o_rServerOrientation ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );
  if( m_CachedFrame.m_ApplicationInfo )
  {
    switch(m_CachedFrame.m_ApplicationInfo.get().m_AxisOrientation )
    {
      case  ViconCGStream::VApplicationInfo::EYUp:
        o_rServerOrientation = ServerOrientation::YUp;
        break;
      case ViconCGStream::VApplicationInfo::EZUp:
        o_rServerOrientation = ServerOrientation::ZUp;
        break;
      default:
        o_rServerOrientation=ServerOrientation::Unknown;
        break;
    }
    return Result::Success;
  }
  else
  {
    o_rServerOrientation=ServerOrientation::Unknown;
    return Result::NotSupported;
  }
  
}